

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O2

void __thiscall duckdb::StandardBufferManager::ReserveMemory(StandardBufferManager *this,idx_t size)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> args_1;
  idx_t in_RCX;
  undefined1 in_stack_ffffffffffffffb0 [24];
  TempBufferPoolReservation reservation;
  
  if (size != 0) {
    StringUtil::BytesToHumanReadableString_abi_cxx11_
              ((string *)&stack0xffffffffffffffb0,(StringUtil *)size,0x400,in_RCX);
    args_1._M_string_length = in_stack_ffffffffffffffb0._0_8_;
    args_1.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )in_stack_ffffffffffffffb0._8_16_;
    args_1._M_dataplus._M_p = &stack0xffffffffffffffb0;
    EvictBlocksOrThrow<char_const*,std::__cxx11::string>
              (&reservation,this,EXTENSION,size,
               (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *)0x0,
               "failed to reserve memory data of size %s%s",args_1);
    ::std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
    reservation.super_BufferPoolReservation.size = 0;
    TempBufferPoolReservation::~TempBufferPoolReservation(&reservation);
  }
  return;
}

Assistant:

void StandardBufferManager::ReserveMemory(idx_t size) {
	if (size == 0) {
		return;
	}
	auto reservation =
	    EvictBlocksOrThrow(MemoryTag::EXTENSION, size, nullptr, "failed to reserve memory data of size %s%s",
	                       StringUtil::BytesToHumanReadableString(size));
	reservation.size = 0;
}